

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

int wait_for_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  uint __i;
  int iVar1;
  long lVar2;
  int *piVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  int so_error;
  socklen_t len;
  timeval tv;
  fd_set fdset;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fdset.fds_bits[lVar2] = 0;
  }
  fdset.fds_bits[socket_io_instance->socket / 0x40] =
       fdset.fds_bits[socket_io_instance->socket / 0x40] |
       1L << ((byte)socket_io_instance->socket & 0x3f);
  tv.tv_sec = 10;
  tv.tv_usec = 0;
  do {
    iVar1 = select(socket_io_instance->socket + 1,(fd_set *)0x0,(fd_set *)&fdset,(fd_set *)0x0,
                   (timeval *)&tv);
    if (-1 < iVar1) {
      if (iVar1 == 1) {
        so_error = 0;
        len = 4;
        iVar1 = getsockopt(socket_io_instance->socket,1,4,&so_error,&len);
        if (iVar1 != 0) {
          p_Var4 = xlogging_get_log_function();
          iVar1 = 0x2b6;
          if (p_Var4 != (LOGGER_LOG)0x0) {
            piVar3 = __errno_location();
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                      ,"wait_for_socket_connection",0x2b5,1,"Failure: getsockopt failure %d.",
                      *piVar3);
          }
          goto LAB_00104ec1;
        }
        if (so_error == 0) {
          return 0;
        }
        p_Var4 = xlogging_get_log_function();
        iVar1 = 700;
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00104ec1;
        pcVar6 = "Failure: connect failure %d.";
        iVar5 = 699;
        goto LAB_00104ebc;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  p_Var4 = xlogging_get_log_function();
  iVar1 = 0x2ac;
  if (p_Var4 != (LOGGER_LOG)0x0) {
    pcVar6 = "Failure: select failure.";
    iVar5 = 0x2ab;
LAB_00104ebc:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
              ,"wait_for_socket_connection",iVar5,1,pcVar6);
  }
LAB_00104ec1:
  if (-1 < socket_io_instance->socket) {
    close(socket_io_instance->socket);
  }
  socket_io_instance->socket = -1;
  return iVar1;
}

Assistant:

static int wait_for_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int err;
    int retval;
    int select_errno = 0;

    fd_set fdset;
    struct timeval tv;

    FD_ZERO(&fdset);
    FD_SET(socket_io_instance->socket, &fdset);
    tv.tv_sec = CONNECT_TIMEOUT;
    tv.tv_usec = 0;

    do
    {
        retval = select(socket_io_instance->socket + 1, NULL, &fdset, NULL, &tv);

        if (retval < 0)
        {
            select_errno = errno;
        }
    } while (retval < 0 && select_errno == EINTR);

    if (retval != 1)
    {
        LogError("Failure: select failure.");
        result = MU_FAILURE;
    }
    else
    {
        int so_error = 0;
        socklen_t len = sizeof(so_error);
        err = getsockopt(socket_io_instance->socket, SOL_SOCKET, SO_ERROR, &so_error, &len);
        if (err != 0)
        {
            LogError("Failure: getsockopt failure %d.", errno);
            result = MU_FAILURE;
        }
        else if (so_error != 0)
        {
            err = so_error;
            LogError("Failure: connect failure %d.", so_error);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    if (result != 0)
    {
        if (socket_io_instance->socket >= SOCKET_SUCCESS)
        {
            close(socket_io_instance->socket);
        }
        socket_io_instance->socket = INVALID_SOCKET;
    }

    return result;
}